

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::_validate(Option *this,string *result,int index)

{
  bool bVar1;
  ulong uVar2;
  int in_ECX;
  Validator *in_RDX;
  long in_RSI;
  string *in_RDI;
  ValidationError *err;
  int v;
  Validator *vali;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range1;
  string *err_msg;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  string *this_00;
  string local_80 [52];
  int local_4c;
  reference local_48;
  Validator *local_40;
  __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
  local_38;
  long local_30;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar3;
  
  uVar3 = (uint)in_stack_ffffffffffffffe0;
  this_00 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) || (*(int *)(in_RSI + 0x170) != 0)) {
    local_30 = in_RSI + 0x178;
    local_38._M_current =
         (Validator *)
         std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin
                   ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_40 = (Validator *)
               std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end
                         ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)this_00,
                              (__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
          bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                 ::operator*(&local_38);
      in_stack_ffffffffffffff5c = Validator::get_application_index(local_48);
      local_4c = in_stack_ffffffffffffff5c;
      if ((in_stack_ffffffffffffff5c == -1) || (in_stack_ffffffffffffff5c == in_ECX)) {
        Validator::operator()(in_RDX,(string *)CONCAT44(in_ECX,uVar3));
        ::std::__cxx11::string::operator=((string *)this_00,local_80);
        ::std::__cxx11::string::~string(local_80);
        uVar2 = ::std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          return in_RDI;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator++(&local_38);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Option::_validate(std::string &result, int index) const {
    std::string err_msg;
    if(result.empty() && expected_min_ == 0) {
        // an empty with nothing expected is allowed
        return err_msg;
    }
    for(const auto &vali : validators_) {
        auto v = vali.get_application_index();
        if(v == -1 || v == index) {
            try {
                err_msg = vali(result);
            } catch(const ValidationError &err) {
                err_msg = err.what();
            }
            if(!err_msg.empty())
                break;
        }
    }

    return err_msg;
}